

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  char cVar1;
  float fVar2;
  uint uVar3;
  float fVar4;
  size_t sVar5;
  char *pcVar6;
  float *pfVar7;
  char *pcVar8;
  char *pcVar9;
  float scale;
  float fVar10;
  float fVar11;
  ImVec2 IVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  float fVar16;
  uint c;
  uint local_70;
  float local_6c;
  float local_68;
  float fStack_64;
  uint uStack_60;
  float fStack_5c;
  float local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  char **local_40;
  ImFont *local_38;
  
  local_6c = max_width;
  local_40 = remaining;
  if (text_end == (char *)0x0) {
    sVar5 = strlen(text_begin);
    text_end = text_begin + sVar5;
  }
  scale = size / this->FontSize;
  fVar13 = 0.0;
  fVar14 = 0.0;
  uVar15 = 0;
  fVar16 = 0.0;
  local_38 = this;
LAB_00139f81:
  pcVar6 = (char *)0x0;
  pcVar8 = text_begin;
LAB_00139f83:
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  fVar11 = fVar14;
  fVar10 = 0.0;
  fVar2 = fVar13;
  uVar3 = uVar15;
  fVar4 = fVar16;
LAB_00139f8e:
  fStack_5c = fVar4;
  uStack_60 = uVar3;
  fStack_64 = fVar14;
  local_68 = fVar2;
  local_58 = fVar10;
  text_begin = pcVar8;
  pcVar9 = text_begin;
  if (text_end <= text_begin) goto LAB_0013a107;
  if (0.0 < wrap_width) {
    if (pcVar6 == (char *)0x0) {
      pcVar6 = CalcWordWrapPositionA(local_38,scale,text_begin,text_end,wrap_width - local_58);
      pcVar6 = pcVar6 + (pcVar6 == text_begin);
      fVar13 = local_68;
      fVar11 = fStack_64;
      uVar15 = uStack_60;
      fVar16 = fStack_5c;
    }
    if (pcVar6 <= text_begin) {
      if (fVar13 < local_58) {
        fVar13 = local_58;
      }
      fVar14 = fVar11 + size;
      goto LAB_0013a0cf;
    }
  }
  local_70 = (uint)*text_begin;
  if (*text_begin < '\0') {
    uVar15 = ImTextCharFromUtf8(&local_70,text_begin,text_end);
    pcVar8 = text_begin + uVar15;
    pcVar9 = pcVar8;
    fVar13 = local_68;
    fVar11 = fStack_64;
    uVar15 = uStack_60;
    fVar16 = fStack_5c;
    if (local_70 == 0) goto LAB_0013a107;
  }
  else {
    pcVar8 = text_begin + 1;
  }
  if (local_70 < 0x20) goto code_r0x0013a038;
  goto LAB_0013a042;
LAB_0013a0cf:
  if (text_end <= text_begin) goto LAB_00139f81;
  cVar1 = *text_begin;
  if ((cVar1 != '\t') && (cVar1 != ' ')) {
    text_begin = text_begin + (cVar1 == '\n');
    goto LAB_00139f81;
  }
  text_begin = text_begin + 1;
  goto LAB_0013a0cf;
code_r0x0013a038:
  fVar10 = local_58;
  fVar2 = fVar13;
  fVar14 = fVar11;
  uVar3 = uVar15;
  fVar4 = fVar16;
  if (local_70 == 0xd) goto LAB_00139f8e;
  if (local_70 != 10) {
LAB_0013a042:
    pfVar7 = &this->FallbackXAdvance;
    if ((int)local_70 < (this->IndexXAdvance).Size) {
      pfVar7 = ImVector<float>::operator[](&this->IndexXAdvance,local_70);
      fVar13 = local_68;
      fVar11 = fStack_64;
      uVar15 = uStack_60;
      fVar16 = fStack_5c;
    }
    fVar10 = *pfVar7 * scale + local_58;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    pcVar9 = text_begin;
    fVar2 = local_68;
    fVar14 = fStack_64;
    uVar3 = uStack_60;
    fVar4 = fStack_5c;
    if (local_6c <= fVar10) {
LAB_0013a107:
      if (local_40 != (char **)0x0) {
        *local_40 = pcVar9;
      }
      if (fVar13 < local_58) {
        fVar13 = local_58;
      }
      if (fVar11 == 0.0 || 0.0 < local_58) {
        fVar11 = fVar11 + size;
      }
      IVar12.y = fVar11;
      IVar12.x = fVar13;
      return IVar12;
    }
    goto LAB_00139f8e;
  }
  uVar15 = uStack_54 & (uint)fVar11;
  fVar13 = (float)(~-(uint)(local_58 <= fVar13) & (uint)local_58 |
                  -(uint)(local_58 <= fVar13) & (uint)fVar13);
  fVar14 = fVar11 + size;
  fVar16 = fVar11;
  goto LAB_00139f83;
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0,0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsSpace(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0)
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexXAdvance.Size ? IndexXAdvance[(int)c] : FallbackXAdvance) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}